

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O2

Bdd __thiscall
sylvan::Bdd::VectorCube(Bdd *this,vector<sylvan::Bdd,_std::allocator<sylvan::Bdd>_> *variables)

{
  ulong uVar1;
  
  bddOne();
  uVar1 = (ulong)(*(long *)(variables + 8) - *(long *)variables) >> 3 & 0xffffffff;
  while( true ) {
    uVar1 = uVar1 - 1;
    if ((int)(uint)uVar1 < 0) break;
    operator*=(this,(Bdd *)((ulong)((uint)uVar1 & 0x7fffffff) * 8 + *(long *)variables));
  }
  return (Bdd)(BDD)this;
}

Assistant:

Bdd
Bdd::VectorCube(const std::vector<Bdd> variables)
{
    Bdd result = Bdd::bddOne();
    for (int i=variables.size()-1; i>=0; i--) {
        result *= variables[i];
    }
    return result;
}